

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall despot::VNode::PrintPolicyTree(VNode *this,int depth,ostream *os)

{
  bool bVar1;
  int iVar2;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this_00;
  size_type sVar3;
  ostream *poVar4;
  void *pvVar5;
  reference ppQVar6;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_01;
  pointer __x;
  ulong uVar7;
  reference pvVar8;
  VNode *this_02;
  double dVar9;
  double dVar10;
  ValuedAction VVar11;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  int local_a4;
  _Self _Stack_a0;
  int i;
  _Self local_98;
  _Self local_90;
  iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *vnodes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  QNode *qnode;
  QNode *pQStack_48;
  int a;
  QNode *qstar;
  ACT_TYPE astar;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *qnodes;
  ostream *os_local;
  int depth_local;
  VNode *this_local;
  
  if ((depth == -1) || (iVar2 = VNode::depth(this), iVar2 <= depth)) {
    this_00 = children(this);
    sVar3 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this_00);
    if (sVar3 == 0) {
      VVar11 = default_move(this);
      poVar4 = (ostream *)std::ostream::operator<<(os,this);
      poVar4 = std::operator<<(poVar4,"-a=");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,VVar11.action);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      pQStack_48 = (QNode *)0x0;
      for (qnode._4_4_ = 0;
          sVar3 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this_00),
          (ulong)(long)qnode._4_4_ < sVar3; qnode._4_4_ = qnode._4_4_ + 1) {
        ppQVar6 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                            (this_00,(long)qnode._4_4_);
        labels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*ppQVar6;
        if (pQStack_48 == (QNode *)0x0) {
LAB_001cab5c:
          pQStack_48 = (QNode *)labels.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          dVar9 = QNode::lower_bound((QNode *)labels.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          dVar10 = QNode::lower_bound(pQStack_48);
          if (dVar10 < dVar9) goto LAB_001cab5c;
        }
      }
      poVar4 = (ostream *)std::ostream::operator<<(os,this);
      poVar4 = std::operator<<(poVar4,"-a=");
      iVar2 = QNode::edge(pQStack_48);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar2);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes);
      this_01 = QNode::children(pQStack_48);
      local_90._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
           ::begin(this_01);
      while( true ) {
        local_98._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
             ::end(this_01);
        bVar1 = std::operator!=(&local_90,&local_98);
        if (!bVar1) break;
        __x = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                        (&local_90);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes,&__x->first);
        _Stack_a0 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::
                    operator++(&local_90,0);
      }
      for (local_a4 = 0; uVar7 = (ulong)local_a4,
          sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes),
          uVar7 < sVar3; local_a4 = local_a4 + 1) {
        if ((depth == -1) || (iVar2 = VNode::depth(this), iVar2 + 1 <= depth)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"|   ",&local_e9);
          iVar2 = VNode::depth(this);
          repeat(&local_c8,&local_e8,iVar2);
          poVar4 = std::operator<<(os,(string *)&local_c8);
          poVar4 = std::operator<<(poVar4,"| o=");
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes,
                              (long)local_a4);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar8);
          std::operator<<(poVar4,": ");
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator(&local_e9);
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes,
                              (long)local_a4);
          this_02 = QNode::Child(pQStack_48,*pvVar8);
          PrintPolicyTree(this_02,depth,os);
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes);
    }
  }
  return;
}

Assistant:

void VNode::PrintPolicyTree(int depth, ostream& os) {
	if (depth != -1 && this->depth() > depth)
		return;

	vector<QNode*>& qnodes = children();
	if (qnodes.size() == 0) {
		ACT_TYPE astar = this->default_move().action;
		os << this << "-a=" << astar << endl;
	} else {
		QNode* qstar = NULL;
		for (int a = 0; a < qnodes.size(); a++) {
			QNode* qnode = qnodes[a];
			if (qstar == NULL || qnode->lower_bound() > qstar->lower_bound()) {
				qstar = qnode;
			}
		}

		os << this << "-a=" << qstar->edge() << endl;

		vector<OBS_TYPE> labels;
		map<OBS_TYPE, VNode*>& vnodes = qstar->children();
		for (map<OBS_TYPE, VNode*>::iterator it = vnodes.begin();
			it != vnodes.end(); it++) {
			labels.push_back(it->first);
		}

		for (int i = 0; i < labels.size(); i++) {
			if (depth == -1 || this->depth() + 1 <= depth) {
				os << repeat("|   ", this->depth()) << "| o=" << labels[i]
					<< ": ";
				qstar->Child(labels[i])->PrintPolicyTree(depth, os);
			}
		}
	}
}